

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdpvi.cpp
# Opt level: O2

void __thiscall acasx::MDPVI::storeQValues(MDPVI *this)

{
  pointer piVar1;
  char cVar2;
  ulong uVar3;
  ostream *poVar4;
  int k;
  ulong uVar5;
  MDP *this_00;
  int *a;
  pointer piVar6;
  int cStateOrder;
  double dVar7;
  vector<int,_std::allocator<int>_> actions;
  ofstream actionFileWriter;
  ofstream costFileWriter;
  ofstream indexFileWriter;
  
  std::ofstream::ofstream(&indexFileWriter);
  std::ofstream::open((char *)&indexFileWriter,0x10b601);
  std::ofstream::ofstream(&costFileWriter);
  std::ofstream::open((char *)&costFileWriter,0x10b6b9);
  std::ofstream::ofstream(&actionFileWriter);
  std::ofstream::open((char *)&actionFileWriter,0x10b6d6);
  cVar2 = std::__basic_file<char>::is_open();
  if (((cVar2 != '\0') && (cVar2 = std::__basic_file<char>::is_open(), cVar2 != '\0')) &&
     (cVar2 = std::__basic_file<char>::is_open(), cVar2 != '\0')) {
    uVar5 = 0;
    while( true ) {
      this_00 = this->mdp;
      uVar3 = (ulong)this_00->numCStates;
      if ((long)uVar3 <= (long)uVar5) break;
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&indexFileWriter,(int)uVar5);
      std::operator<<(poVar4,"\n");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&actionFileWriter,0);
      std::operator<<(poVar4,"\n");
      poVar4 = std::ostream::_M_insert<double>((*this->U)[uVar5]);
      uVar5 = uVar5 + 1;
      std::operator<<(poVar4,"\n");
    }
    for (k = 1; k != 0x16; k = k + 1) {
      for (cStateOrder = 0; cStateOrder < (int)uVar3; cStateOrder = cStateOrder + 1) {
        MDP::actions(&actions,this_00,cStateOrder);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&indexFileWriter,(int)uVar5);
        std::operator<<(poVar4,"\n");
        piVar1 = actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (piVar6 = actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start; piVar6 != piVar1; piVar6 = piVar6 + 1) {
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&actionFileWriter,*piVar6);
          std::operator<<(poVar4,"\n");
          dVar7 = getQValue(this,k,cStateOrder,*piVar6);
          poVar4 = std::ostream::_M_insert<double>(dVar7);
          std::operator<<(poVar4,"\n");
        }
        uVar5 = (ulong)(uint)((int)uVar5 +
                             (int)((ulong)((long)actions.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish -
                                          (long)actions.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start) >> 2));
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&actions.super__Vector_base<int,_std::allocator<int>_>);
        this_00 = this->mdp;
        uVar3 = (ulong)(uint)this_00->numCStates;
      }
    }
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&indexFileWriter,(int)uVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::endl<char,std::char_traits<char>>((ostream *)&actionFileWriter);
    std::endl<char,std::char_traits<char>>((ostream *)&costFileWriter);
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::~ofstream(&actionFileWriter);
    std::ofstream::~ofstream(&costFileWriter);
    std::ofstream::~ofstream(&indexFileWriter);
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"failure in opening files");
  std::endl<char,std::char_traits<char>>(poVar4);
  abort();
}

Assistant:

void MDPVI::storeQValues()
{
    ofstream indexFileWriter;
    indexFileWriter.open("indexFile", ios_base::out|ios_base::trunc);
    ofstream costFileWriter;
    costFileWriter.open("costFile", ios_base::out|ios_base::trunc);
    ofstream actionFileWriter;
    actionFileWriter.open("actionFile", ios_base::out|ios_base::trunc);

    if(!indexFileWriter.is_open() || !costFileWriter.is_open() || !actionFileWriter.is_open())
    {
        cerr<<"failure in opening files"<<endl;
        abort();
    }

    int index=0;
    for (int i=0; i<mdp->getCStatesNum(); ++i)//T=k=0
    {
        indexFileWriter<<index<<"\n";
        actionFileWriter<<0<<"\n";  //leaving states, using O to avoid arrayIndexOutofRange problem
        index++;
        costFileWriter<<U[0][i]<<"\n";
    }

    for(int k=1; k<=TIME_HORIZON+1; ++k )
    {
        for (int i=0; i<mdp->getCStatesNum();++i)
        {
            vector<int> actions=mdp->actions(i);
            indexFileWriter<<index<<"\n";
            for (int& a :actions )
            {
                actionFileWriter<<a<<"\n";
                double QValue = getQValue(k, i, a);
                costFileWriter<<QValue<<"\n";
            }
            index+=actions.size();
        }
    }

    indexFileWriter<<index<<endl;
    actionFileWriter<<endl;
    costFileWriter<<endl;

    indexFileWriter.close();
    costFileWriter.close();
    actionFileWriter.close();

}